

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt.h
# Opt level: O2

void __thiscall mp::pre::LinkRangeList::Add(LinkRangeList *this,LinkRange br)

{
  _Elt_pointer pLVar1;
  value_type local_10;
  
  local_10.ir_ = br.ir_;
  local_10.b_ = br.b_;
  pLVar1 = (this->super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>).
           super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pLVar1 != (this->super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>).
                super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    if (pLVar1 == (this->super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>).
                  super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl
                  .super__Deque_impl_data._M_finish._M_first) {
      pLVar1 = (this->super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>).
               super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    if ((pLVar1[-1].b_ == local_10.b_) && (pLVar1[-1].ir_.end_ == br.ir_.beg_)) {
      pLVar1[-1].ir_.end_ = br.ir_.end_;
      return;
    }
  }
  std::deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>::push_back
            (&this->super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>,&local_10);
  return;
}

Assistant:

void Add(LinkRange br) {
    if (empty() || !back().TryExtendBy(br))
      push_back(br);
  }